

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O2

string * __thiscall
Kernel::InferenceStore::TPTPProofPrinter::
getNewSymbols<Lib::Stack<std::pair<Kernel::SymbolType,unsigned_int>>::ConstIterator>
          (string *__return_storage_ptr__,TPTPProofPrinter *this,string *origin,ConstIterator symIt)

{
  pair<Kernel::SymbolType,_unsigned_int> pVar1;
  pair<Kernel::SymbolType,_unsigned_int> *ppVar2;
  string *psVar3;
  long lVar4;
  pair<Kernel::SymbolType,_unsigned_int> *ppVar5;
  string local_1e8;
  string local_1c8;
  ostringstream symsStr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&symsStr);
  ppVar2 = symIt.super_ConstRefIterator._pointer;
  do {
    ppVar5 = ppVar2 + -1;
    if (ppVar2 == (symIt.super_ConstRefIterator._stack)->_stack) {
      std::__cxx11::string::string((string *)&local_1c8,(string *)origin);
      std::__cxx11::stringbuf::str();
      getNewSymbols(__return_storage_ptr__,this,&local_1c8,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&symsStr);
      return __return_storage_ptr__;
    }
    pVar1 = *ppVar5;
    if (pVar1.first == PRED) {
      lVar4 = 0x80;
LAB_004319a0:
      psVar3 = *(string **)
                (*(long *)((long)&(DAT_00a14190->_dividesNvalues)._capacity + lVar4) +
                ((long)pVar1 >> 0x20) * 8);
    }
    else {
      if (pVar1.first != FUNC) {
        lVar4 = 0xa0;
        goto LAB_004319a0;
      }
      psVar3 = Signature::functionName_abi_cxx11_(DAT_00a14190,pVar1.second);
    }
    std::operator<<((ostream *)&symsStr,(string *)psVar3);
    ppVar2 = ppVar5;
    if (ppVar5 != (symIt.super_ConstRefIterator._stack)->_stack) {
      std::operator<<((ostream *)&symsStr,',');
    }
  } while( true );
}

Assistant:

std::string getNewSymbols(std::string origin, It symIt) {
    std::ostringstream symsStr;
    while(symIt.hasNext()) {
      SymbolId sym = symIt.next();
      if (sym.first == SymbolType::FUNC ) {
        symsStr << env.signature->functionName(sym.second);
      } else if (sym.first == SymbolType::PRED){
        symsStr << env.signature->predicateName(sym.second);
      } else {
        symsStr << env.signature->typeConName(sym.second);
      }
      if (symIt.hasNext()) {
        symsStr << ',';
      }
    }
    return getNewSymbols(origin, symsStr.str());
  }